

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.c
# Opt level: O1

configuration configuration_create(char *scope,char *path,char *parent,void *allocator)

{
  int iVar1;
  configuration pcVar2;
  
  pcVar2 = configuration_singleton_get(scope);
  if (pcVar2 == (configuration)0x0) {
    pcVar2 = configuration_scope(parent);
    pcVar2 = configuration_object_initialize(scope,path,pcVar2);
    if (pcVar2 == (configuration)0x0) {
      pcVar2 = (configuration)0x0;
      log_write_impl_va("metacall",0x91,"configuration_create",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/configuration/source/configuration.c"
                        ,3,"Invalid configuration (%s) scope map creation [%s]",scope,path);
    }
    else {
      iVar1 = configuration_impl_load(pcVar2,allocator);
      if (iVar1 != 0) {
        log_write_impl_va("metacall",0x98,"configuration_create",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/configuration/source/configuration.c"
                          ,3,"Invalid configuration implementation load <%p>",pcVar2);
        configuration_object_destroy(pcVar2);
        pcVar2 = (configuration)0x0;
      }
    }
  }
  return pcVar2;
}

Assistant:

configuration configuration_create(const char *scope, const char *path, const char *parent, void *allocator)
{
	configuration config = configuration_singleton_get(scope);

	if (config != NULL)
	{
		return config;
	}

	config = configuration_object_initialize(scope, path, configuration_scope(parent));

	if (config == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid configuration (%s) scope map creation [%s]", scope, path);

		return NULL;
	}

	if (configuration_impl_load(config, allocator) != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid configuration implementation load <%p>", config);

		configuration_object_destroy(config);

		return NULL;
	}

	return config;
}